

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

lws_mqtt_subs_t * lws_mqtt_find_sub(_lws_mqtt_related *mqtt,char *topic)

{
  int iVar1;
  lws_mqtt_subs_t *plVar2;
  
  plVar2 = (lws_mqtt_subs_t *)&mqtt->subs_head;
  do {
    plVar2 = plVar2->next;
    if (plVar2 == (lws_mqtt_subs_t *)0x0) {
      return (lws_mqtt_subs_t *)0x0;
    }
    iVar1 = strcmp(&plVar2->field_0x9,topic);
  } while (iVar1 != 0);
  return plVar2;
}

Assistant:

lws_mqtt_subs_t *
lws_mqtt_find_sub(struct _lws_mqtt_related *mqtt, const char *topic)
{
	lws_mqtt_subs_t *s = mqtt->subs_head;

	while (s) {
		if (!strcmp((const char *)s->topic, topic))
			return s;
		s = s->next;
	}

	return NULL;
}